

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.h
# Opt level: O0

__pid_t __thiscall MppMutexCond::wait(MppMutexCond *this,void *__stat_loc)

{
  RK_S32 RVar1;
  RK_S64 timeout_local;
  MppMutexCond *this_local;
  
  RVar1 = Condition::timedwait(&this->mCondition,&this->mLock,(RK_S64)__stat_loc);
  return RVar1;
}

Assistant:

RK_S32  wait(RK_S64 timeout) { return mCondition.timedwait(mLock, timeout); }